

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O1

wchar_t cmd_get_arg_direction(command_conflict *cmd,char *arg,int *dir)

{
  bool bVar1;
  int iVar2;
  wchar_t wVar3;
  int iVar4;
  undefined8 in_RCX;
  long lVar5;
  char *__s1;
  
  __s1 = cmd->arg[0].name;
  lVar5 = 4;
  do {
    iVar2 = strcmp(__s1,arg);
    iVar4 = (int)in_RCX;
    if (iVar2 == 0) {
      wVar3 = L'\0';
      if (((cmd_arg *)(__s1 + -0x10))->type == arg_DIRECTION) {
        iVar4 = ((cmd_arg_data_conflict *)(__s1 + -8))->choice;
        bVar1 = true;
      }
      else {
        wVar3 = L'\xfffffffe';
        bVar1 = false;
      }
      goto LAB_0013061d;
    }
    __s1 = __s1 + 0x28;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  bVar1 = false;
  wVar3 = L'\xffffffff';
LAB_0013061d:
  if (bVar1) {
    *dir = iVar4;
  }
  return wVar3;
}

Assistant:

int cmd_get_arg_direction(struct command *cmd, const char *arg, int *dir)
{
	union cmd_arg_data data;
	int err;

	if ((err = cmd_get_arg(cmd, arg, arg_DIRECTION, &data)) == CMD_OK)
		*dir = data.direction;

	return err;
}